

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

int32_t res_countArrayItems_63(ResourceData *pResData,Resource res)

{
  uint uVar1;
  
  if (res >> 0x1c < 0xf) {
    uVar1 = res & 0xfffffff;
    switch(res >> 0x1c) {
    default:
      return 1;
    case 2:
      if (uVar1 != 0) {
        return (int32_t)*(ushort *)(pResData->pRoot + uVar1);
      }
      break;
    case 4:
    case 8:
      if (uVar1 != 0) {
        return pResData->pRoot[uVar1];
      }
      break;
    case 5:
    case 9:
      return (int32_t)pResData->p16BitUnits[uVar1];
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      break;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
res_countArrayItems(const ResourceData *pResData, Resource res) {
    uint32_t offset=RES_GET_OFFSET(res);
    switch(RES_GET_TYPE(res)) {
    case URES_STRING:
    case URES_STRING_V2:
    case URES_BINARY:
    case URES_ALIAS:
    case URES_INT:
    case URES_INT_VECTOR:
        return 1;
    case URES_ARRAY:
    case URES_TABLE32:
        return offset==0 ? 0 : *(pResData->pRoot+offset);
    case URES_TABLE:
        return offset==0 ? 0 : *((const uint16_t *)(pResData->pRoot+offset));
    case URES_ARRAY16:
    case URES_TABLE16:
        return pResData->p16BitUnits[offset];
    default:
        return 0;
    }
}